

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpression.cxx
# Opt level: O2

string * cmGeneratorExpression::Evaluate
                   (string *__return_storage_ptr__,string *input,cmLocalGenerator *lg,string *config
                   ,cmGeneratorTarget *headTarget,cmGeneratorExpressionDAGChecker *dagChecker,
                   cmGeneratorTarget *currentTarget,string *language)

{
  size_type sVar1;
  string *psVar2;
  cmCompiledGeneratorExpression cge;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_1c8;
  string local_1b8;
  cmCompiledGeneratorExpression local_198;
  
  sVar1 = Find(input);
  if (sVar1 == 0xffffffffffffffff) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)input);
  }
  else {
    local_1c8.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_1c8.TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_1c8);
    std::__cxx11::string::string((string *)&local_1b8,(string *)input);
    cmCompiledGeneratorExpression::cmCompiledGeneratorExpression
              (&local_198,(cmListFileBacktrace *)&local_1c8,&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_1c8.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    psVar2 = cmCompiledGeneratorExpression::Evaluate
                       (&local_198,lg,config,headTarget,dagChecker,currentTarget,language);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
    cmCompiledGeneratorExpression::~cmCompiledGeneratorExpression(&local_198);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorExpression::Evaluate(
  std::string input, cmLocalGenerator* lg, const std::string& config,
  cmGeneratorTarget const* headTarget,
  cmGeneratorExpressionDAGChecker* dagChecker,
  cmGeneratorTarget const* currentTarget, std::string const& language)
{
  if (Find(input) != std::string::npos) {
    cmCompiledGeneratorExpression cge(cmListFileBacktrace(), std::move(input));
    return cge.Evaluate(lg, config, headTarget, dagChecker, currentTarget,
                        language);
  }
  return input;
}